

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::updateIsOpaque(QWidgetPrivate *this)

{
  bool bVar1;
  BrushStyle BVar2;
  QPalette *pQVar3;
  ulong uVar4;
  QWidgetPrivate *in_RDI;
  QBrush *windowBrush;
  QBrush *autoFillBrush;
  QPalette *pal;
  QWidget *q;
  QPalette *in_stack_ffffffffffffffc8;
  QWidget *in_stack_ffffffffffffffd8;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  
  setDirtyOpaqueRegion(in_stack_ffffffffffffffe0);
  if (in_RDI->graphicsEffect == (QGraphicsEffect *)0x0) {
    q_func(in_RDI);
    bVar1 = QWidget::testAttribute
                      (in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)in_RDI >> 0x20));
    if ((bVar1) ||
       (bVar1 = QWidget::testAttribute
                          (in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)in_RDI >> 0x20)),
       bVar1)) {
      setOpaque(in_RDI,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
    }
    else {
      pQVar3 = QWidget::palette((QWidget *)in_RDI);
      bVar1 = QWidget::autoFillBackground((QWidget *)in_RDI);
      if (bVar1) {
        QWidget::backgroundRole(in_stack_ffffffffffffffd8);
        QPalette::brush((QPalette *)in_RDI,(ColorRole)((ulong)pQVar3 >> 0x20));
        BVar2 = QBrush::style((QBrush *)0x35b821);
        in_stack_ffffffffffffffc8 = pQVar3;
        if ((BVar2 != NoBrush) &&
           (uVar4 = QBrush::isOpaque(), in_stack_ffffffffffffffc8 = pQVar3, (uVar4 & 1) != 0)) {
          setOpaque(in_RDI,SUB81((ulong)pQVar3 >> 0x38,0));
          return;
        }
      }
      bVar1 = QWidget::isWindow((QWidget *)in_RDI);
      if ((bVar1) &&
         (bVar1 = QWidget::testAttribute
                            (in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)in_RDI >> 0x20)),
         !bVar1)) {
        QWidget::palette((QWidget *)in_RDI);
        QPalette::brush((QPalette *)in_RDI,(ColorRole)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        BVar2 = QBrush::style((QBrush *)0x35b8a4);
        if ((BVar2 != NoBrush) && (uVar4 = QBrush::isOpaque(), (uVar4 & 1) != 0)) {
          setOpaque(in_RDI,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
          return;
        }
      }
      setOpaque(in_RDI,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
    }
  }
  else {
    setOpaque(in_RDI,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
  }
  return;
}

Assistant:

void QWidgetPrivate::updateIsOpaque()
{
    // hw: todo: only needed if opacity actually changed
    setDirtyOpaqueRegion();

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect) {
        // ### We should probably add QGraphicsEffect::isOpaque at some point.
        setOpaque(false);
        return;
    }
#endif // QT_CONFIG(graphicseffect)

    Q_Q(QWidget);
    if (q->testAttribute(Qt::WA_OpaquePaintEvent) || q->testAttribute(Qt::WA_PaintOnScreen)) {
        setOpaque(true);
        return;
    }

    const QPalette &pal = q->palette();

    if (q->autoFillBackground()) {
        const QBrush &autoFillBrush = pal.brush(q->backgroundRole());
        if (autoFillBrush.style() != Qt::NoBrush && autoFillBrush.isOpaque()) {
            setOpaque(true);
            return;
        }
    }

    if (q->isWindow() && !q->testAttribute(Qt::WA_NoSystemBackground)) {
        const QBrush &windowBrush = q->palette().brush(QPalette::Window);
        if (windowBrush.style() != Qt::NoBrush && windowBrush.isOpaque()) {
            setOpaque(true);
            return;
        }
    }
    setOpaque(false);
}